

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Load_Char(FT_Face face,FT_ULong char_code,FT_Int32 load_flags)

{
  FT_UInt FVar1;
  FT_Error FVar2;
  
  if (face != (FT_Face)0x0) {
    if (face->charmap != (FT_CharMap)0x0) {
      FVar1 = FT_Get_Char_Index(face,char_code);
      char_code = (FT_ULong)FVar1;
    }
    FVar2 = FT_Load_Glyph(face,(FT_UInt)char_code,load_flags);
    return FVar2;
  }
  return 0x23;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Char( FT_Face   face,
                FT_ULong  char_code,
                FT_Int32  load_flags )
  {
    FT_UInt  glyph_index;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    glyph_index = (FT_UInt)char_code;
    if ( face->charmap )
      glyph_index = FT_Get_Char_Index( face, char_code );

    return FT_Load_Glyph( face, glyph_index, load_flags );
  }